

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::GenerateGraphViz(cmake *this,string *fileName)

{
  string *psVar1;
  string fallbackSettingsFile;
  string settingsFile;
  cmGraphVizWriter gvWriter;
  string sStack_168;
  string local_148;
  cmGraphVizWriter local_128;
  
  cmGraphVizWriter::cmGraphVizWriter(&local_128,this->GlobalGenerator);
  psVar1 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)&local_148,(string *)psVar1);
  std::__cxx11::string::append((char *)&local_148);
  psVar1 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)&sStack_168,(string *)psVar1);
  std::__cxx11::string::append((char *)&sStack_168);
  cmGraphVizWriter::ReadSettings(&local_128,&local_148,&sStack_168);
  cmGraphVizWriter::WritePerTargetFiles(&local_128,fileName);
  cmGraphVizWriter::WriteTargetDependersFiles(&local_128,fileName);
  cmGraphVizWriter::WriteGlobalFile(&local_128,fileName);
  std::__cxx11::string::~string((string *)&sStack_168);
  std::__cxx11::string::~string((string *)&local_148);
  cmGraphVizWriter::~cmGraphVizWriter(&local_128);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const std::string& fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmGraphVizWriter gvWriter(this->GetGlobalGenerator());

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter.ReadSettings(settingsFile, fallbackSettingsFile);
  gvWriter.WritePerTargetFiles(fileName);
  gvWriter.WriteTargetDependersFiles(fileName);
  gvWriter.WriteGlobalFile(fileName);

#endif
}